

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTestCaseBase.cpp
# Opt level: O2

bool __thiscall
glcts::TestCaseBase::comparePixel
          (TestCaseBase *this,uchar *buffer,uint x,uint y,uint width,uint height,uint pixel_size,
          uchar expected_red,uchar expected_green,uchar expected_blue,uchar expected_alpha)

{
  uint uVar1;
  bool bVar2;
  
  bVar2 = false;
  if ((buffer != (uchar *)0x0) &&
     (uVar1 = x * pixel_size + y * width * pixel_size, bVar2 = false,
     uVar1 <= width * pixel_size * height)) {
    bVar2 = true;
    switch(pixel_size) {
    case 4:
      bVar2 = buffer[uVar1 + 3] == expected_alpha;
    case 3:
      bVar2 = (bool)(bVar2 & buffer[uVar1 + 2] == expected_blue);
    case 2:
      bVar2 = (bool)(bVar2 & buffer[uVar1 + 1] == expected_green);
    case 1:
      bVar2 = (bool)(buffer[uVar1] == expected_red & bVar2);
      break;
    default:
      return false;
    }
  }
  return bVar2;
}

Assistant:

bool TestCaseBase::comparePixel(const unsigned char* buffer, unsigned int x, unsigned int y, unsigned int width,
								unsigned int height, unsigned int pixel_size, unsigned char expected_red,
								unsigned char expected_green, unsigned char expected_blue,
								unsigned char expected_alpha) const
{
	const unsigned int line_size	= width * pixel_size;
	const unsigned int image_size   = height * line_size;
	const unsigned int texel_offset = y * line_size + x * pixel_size;

	bool result = true;

	/* Sanity checks */
	if (0 == buffer)
	{
		return false;
	}

	if (image_size < texel_offset)
	{
		return false;
	}

	switch (pixel_size)
	{
	/* Fall through by design */
	case 4:
	{
		result &= (expected_alpha == buffer[texel_offset + 3]);
	}

	case 3:
	{
		result &= (expected_blue == buffer[texel_offset + 2]);
	}

	case 2:
	{
		result &= (expected_green == buffer[texel_offset + 1]);
	}

	case 1:
	{
		result &= (expected_red == buffer[texel_offset + 0]);

		break;
	}

	default:
	{
		return false;
	}
	} /* switch (pixel_size) */

	return result;
}